

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::quadratic_cost_type
          (quadratic_cost_type<float> *this,objective_function *obj_,int n)

{
  objective_function_element *poVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer poVar5;
  pointer poVar6;
  int iVar7;
  ulong uVar8;
  float *pfVar9;
  quad *__s;
  int *__s_00;
  index *piVar10;
  undefined8 extraout_RAX;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar16 = (ulong)(uint)n * 4;
  this->obj = obj_;
  if (n < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pfVar9 = (float *)operator_new__(uVar16);
  memset(pfVar9,0,uVar16);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar9;
  uVar16 = (long)(obj_->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(obj_->qelements).
                 super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = uVar16 | 8;
  if ((long)uVar16 < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  __s = (quad *)operator_new__(uVar17);
  memset(__s,0,uVar17);
  uVar16 = (ulong)(n + 1) << 2;
  if (n < -1) {
    uVar16 = 0xffffffffffffffff;
  }
  (this->quadratic_elements)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
  .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>._M_head_impl =
       __s;
  __s_00 = (int *)operator_new__(uVar16);
  memset(__s_00,0,uVar16);
  (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = __s_00;
  poVar5 = (obj_->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (long)(obj_->elements).
                 super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)poVar5;
  if ((uVar16 & 0xffffffff0) != 0) {
    piVar10 = &poVar5->variable_index;
    uVar16 = uVar16 >> 4 & 0xffffffff;
    do {
      lVar11 = (long)*piVar10;
      if ((lVar11 < 0) || (n <= *piVar10)) {
LAB_0014c625:
        itm::quadratic_cost_type();
        operator_delete__(__s);
        (this->quadratic_elements)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
        .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
        _M_head_impl = (quad *)0x0;
        pfVar9 = (this->linear_elements)._M_t.
                 super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                 super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                 super__Head_base<0UL,_float_*,_false>._M_head_impl;
        if (pfVar9 != (float *)0x0) {
          operator_delete__(pfVar9);
        }
        (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
        _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl = (float *)0x0;
        _Unwind_Resume(extraout_RAX);
      }
      poVar1 = (objective_function_element *)(piVar10 + -2);
      piVar10 = piVar10 + 4;
      uVar16 = uVar16 - 1;
      pfVar9[lVar11] = (float)poVar1->factor + pfVar9[lVar11];
    } while (uVar16 != 0);
  }
  *__s_00 = 0;
  if (n != 0) {
    iVar12 = 0;
    poVar6 = (obj_->qelements).
             super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar17 = (long)(obj_->qelements).
                   super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)poVar6;
    uVar16 = 0;
    do {
      uVar14 = uVar16 + 1;
      (__s_00 + 1)[uVar16] = iVar12;
      piVar10 = &poVar6->variable_index_b;
      uVar15 = uVar17 >> 4 & 0xffffffff;
      uVar8 = uVar17 & 0xffffffff0;
      while (uVar8 != 0) {
        uVar2 = piVar10[-1];
        if (((long)(int)uVar2 < 0) || (n <= (int)uVar2)) {
          itm::quadratic_cost_type();
LAB_0014c620:
          itm::quadratic_cost_type();
          goto LAB_0014c625;
        }
        uVar3 = *piVar10;
        if (((long)(int)uVar3 < 0) || ((uint)n <= uVar3)) goto LAB_0014c620;
        if (uVar16 == (long)(int)uVar2 || uVar16 == (long)(int)uVar3) {
          iVar12 = iVar12 + 1;
          __s_00[uVar14] = iVar12;
        }
        piVar10 = piVar10 + 4;
        uVar15 = uVar15 - 1;
        uVar8 = uVar15;
      }
      uVar16 = uVar14;
    } while (uVar14 != (uint)n);
    if (n != 0) {
      iVar13 = 0;
      iVar12 = 0;
      poVar6 = (obj_->qelements).
               super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = (long)(obj_->qelements).
                     super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)poVar6;
      do {
        piVar10 = &poVar6->variable_index_b;
        uVar17 = uVar16 >> 4 & 0xffffffff;
        uVar15 = uVar16 & 0xffffffff0;
        while (uVar15 != 0) {
          iVar4 = piVar10[-1];
          if (*piVar10 == iVar13 || iVar4 == iVar13) {
            iVar7 = *piVar10;
            if (iVar4 != iVar13) {
              iVar7 = iVar4;
            }
            __s[iVar12].factor = (float)((objective_quadratic_element *)(piVar10 + -3))->factor;
            __s[iVar12].id = iVar7;
            iVar12 = iVar12 + 1;
          }
          piVar10 = piVar10 + 4;
          uVar17 = uVar17 - 1;
          uVar15 = uVar17;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != n);
    }
  }
  return;
}

Assistant:

quadratic_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(
          std::make_unique<quad[]>(2 * obj.qelements.size() + 1))
      , indices(std::make_unique<int[]>(n + 1))
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i) {
            bx_ensures(0 <= obj.elements[i].variable_index &&
                       obj.elements[i].variable_index < n);

            linear_elements[obj.elements[i].variable_index] +=
              static_cast<Float>(obj.elements[i].factor);
        }

        indices[0] = 0;
        for (int var = 0; var != n; ++var) {
            indices[var + 1] = indices[var];

            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                bx_ensures(0 <= obj.qelements[i].variable_index_a &&
                           obj.qelements[i].variable_index_a < n);
                bx_ensures(0 <= obj.qelements[i].variable_index_b &&
                           obj.qelements[i].variable_index_b < n);

                if (var == obj.qelements[i].variable_index_a ||
                    var == obj.qelements[i].variable_index_b)
                    ++indices[var + 1];
            }
        }

        for (int id = 0, var = 0; var != n; ++var) {
            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                const bool is_a = obj.qelements[i].variable_index_a == var;
                const bool is_b = obj.qelements[i].variable_index_b == var;

                if (is_a || is_b) {
                    quadratic_elements[id].factor =
                      static_cast<Float>(obj.qelements[i].factor);
                    quadratic_elements[id].id =
                      is_a ? obj.qelements[i].variable_index_b
                           : obj.qelements[i].variable_index_a;
                    ++id;
                }
            }
        }
    }